

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O3

int hdr_encode_compressed(hdr_histogram *h,uint8_t **compressed_histogram,size_t *compressed_len)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  int32_t iVar4;
  int iVar5;
  int iVar6;
  undefined4 *__ptr;
  uint8_t *__ptr_00;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uLongf dest_len;
  int local_54;
  long local_50;
  uint8_t **local_48;
  size_t *local_40;
  undefined4 *local_38;
  
  iVar4 = counts_index_for(h,h->max_value);
  iVar6 = iVar4 + 1;
  if (h->counts_len <= iVar4 + 1) {
    iVar6 = h->counts_len;
  }
  __ptr = (undefined4 *)calloc((long)iVar6 * 9 + 0x28,1);
  if (__ptr == (undefined4 *)0x0) {
    local_54 = 0xc;
  }
  else {
    local_54 = 0xc;
    local_48 = compressed_histogram;
    local_40 = compressed_len;
    local_38 = __ptr;
    if (iVar6 < 1) {
      uVar11 = 0;
    }
    else {
      iVar5 = 0;
      uVar11 = 0;
      do {
        lVar10 = h->counts[iVar5];
        iVar8 = iVar5 + 1;
        if (lVar10 == 0) {
          iVar7 = 1;
          if (iVar8 < iVar6) {
            lVar10 = (long)iVar8;
            iVar7 = iVar6 - iVar5;
            iVar9 = -1;
            do {
              if (h->counts[lVar10] != 0) {
                iVar7 = -iVar9;
                iVar8 = iVar5 - iVar9;
                break;
              }
              lVar10 = lVar10 + 1;
              iVar9 = iVar9 + -1;
              iVar8 = iVar6;
            } while (iVar6 != lVar10);
          }
          lVar10 = (long)-iVar7;
        }
        iVar5 = iVar8;
        iVar8 = zig_zag_encode_i64((uint8_t *)((long)__ptr + (long)(int)uVar11 + 0x28),lVar10);
        uVar11 = uVar11 + iVar8;
      } while (iVar5 < iVar6);
    }
    __ptr = local_38;
    *local_38 = 0x1393841c;
    local_38[1] = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                  uVar11 << 0x18;
    uVar1 = h->normalizing_index_offset;
    local_38[2] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = h->significant_figures;
    local_38[3] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar2 = h->lowest_discernible_value;
    *(ulong *)(local_38 + 4) =
         uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
         (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
         (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    uVar2 = h->highest_trackable_value;
    *(ulong *)(local_38 + 6) =
         uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
         (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
         (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    dVar3 = h->conversion_ratio;
    *(ulong *)(local_38 + 8) =
         (ulong)dVar3 >> 0x38 | ((ulong)dVar3 & 0xff000000000000) >> 0x28 |
         ((ulong)dVar3 & 0xff0000000000) >> 0x18 | ((ulong)dVar3 & 0xff00000000) >> 8 |
         ((ulong)dVar3 & 0xff000000) << 8 | ((ulong)dVar3 & 0xff0000) << 0x18 |
         ((ulong)dVar3 & 0xff00) << 0x28 | (long)dVar3 << 0x38;
    local_50 = compressBound((long)(int)uVar11 + 0x28);
    __ptr_00 = (uint8_t *)malloc(local_50 + 8);
    if (__ptr_00 != (uint8_t *)0x0) {
      iVar6 = compress(__ptr_00 + 8,&local_50,__ptr,(long)(int)uVar11 + 0x28);
      if (iVar6 != 0) {
        free(__ptr);
        free(__ptr_00);
        return -0x752c;
      }
      __ptr_00[0] = '\x1c';
      __ptr_00[1] = 0x84;
      __ptr_00[2] = 0x93;
      __ptr_00[3] = '\x14';
      uVar11 = (uint)local_50;
      *(uint *)(__ptr_00 + 4) =
           uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
      *local_48 = __ptr_00;
      *local_40 = local_50 + 8;
      local_54 = 0;
    }
  }
  free(__ptr);
  return local_54;
}

Assistant:

int hdr_encode_compressed(
    struct hdr_histogram* h,
    uint8_t** compressed_histogram,
    size_t* compressed_len)
{
    encoding_flyweight_v1_t* encoded = NULL;
    compression_flyweight_t* compressed = NULL;
    int i;
    int result = 0;
    int data_index = 0;
    int32_t payload_len;
    uLong encoded_size;
    uLongf dest_len;
    size_t compressed_size;

    int32_t len_to_max = counts_index_for(h, h->max_value) + 1;
    int32_t counts_limit = len_to_max < h->counts_len ? len_to_max : h->counts_len;

    const size_t encoded_len = SIZEOF_ENCODING_FLYWEIGHT_V1 + MAX_BYTES_LEB128 * (size_t) counts_limit;
    if ((encoded = (encoding_flyweight_v1_t*) hdr_calloc(encoded_len, sizeof(uint8_t))) == NULL)
    {
        FAIL_AND_CLEANUP(cleanup, result, ENOMEM);
    }

    for (i = 0; i < counts_limit;)
    {
        int64_t value = h->counts[i];
        i++;

        if (value == 0)
        {
            int32_t zeros = 1;

            while (i < counts_limit && 0 == h->counts[i])
            {
                zeros++;
                i++;
            }

            data_index += zig_zag_encode_i64(&encoded->counts[data_index], -zeros);
        }
        else
        {
            data_index += zig_zag_encode_i64(&encoded->counts[data_index], value);
        }
    }

    payload_len = data_index;
    encoded_size = SIZEOF_ENCODING_FLYWEIGHT_V1 + data_index;

    encoded->cookie                   = htobe32(V2_ENCODING_COOKIE | 0x10U);
    encoded->payload_len              = htobe32(payload_len);
    encoded->normalizing_index_offset = htobe32(h->normalizing_index_offset);
    encoded->significant_figures      = htobe32(h->significant_figures);
    encoded->lowest_discernible_value   = htobe64(h->lowest_discernible_value);
    encoded->highest_trackable_value  = htobe64(h->highest_trackable_value);
    encoded->conversion_ratio_bits    = htobe64(double_to_int64_bits(h->conversion_ratio));


    /* Estimate the size of the compressed histogram. */
    dest_len = compressBound(encoded_size);
    compressed_size = SIZEOF_COMPRESSION_FLYWEIGHT + dest_len;

    if ((compressed = (compression_flyweight_t*) hdr_malloc(compressed_size)) == NULL)
    {
        FAIL_AND_CLEANUP(cleanup, result, ENOMEM);
    }

    if (Z_OK != compress(compressed->data, &dest_len, (Bytef*) encoded, encoded_size))
    {
        FAIL_AND_CLEANUP(cleanup, result, HDR_DEFLATE_FAIL);
    }

    compressed->cookie = htobe32(V2_COMPRESSION_COOKIE | 0x10U);
    compressed->length = htobe32((int32_t)dest_len);

    *compressed_histogram = (uint8_t*) compressed;
    *compressed_len = SIZEOF_COMPRESSION_FLYWEIGHT + dest_len;

    cleanup:
    hdr_free(encoded);
    if (result == HDR_DEFLATE_FAIL)
    {
        hdr_free(compressed);
    }

    return result;
}